

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
astar::astar_path(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  *__return_storage_ptr__,astar *this,
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *map)

{
  pointer piVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  int p;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint x;
  int iVar10;
  uint k;
  uint y;
  long lVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  undefined1 local_168 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  open;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  visited;
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> temp_list;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  parentDir;
  vector<int,_std::allocator<int>_> moveX;
  vector<int,_std::allocator<int>_> moveY;
  undefined1 auStack_c8 [8];
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> open_list;
  nodes child;
  undefined1 auStack_78 [8];
  nodes start;
  undefined1 auStack_58 [8];
  nodes current;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  visited.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  open.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_78,800,
             (value_type *)
             &open.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)&temp_list.field_0x18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_168,800,(value_type *)auStack_78,
           (allocator_type *)
           &parentDir.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_78);
  temp_list._24_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_78,800,(value_type *)&temp_list.field_0x18
             ,(allocator_type *)
              &parentDir.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&open.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,800,(value_type *)auStack_78,
           (allocator_type *)
           &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_78);
  parentDir.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_78,800,
             (value_type *)
             &parentDir.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&temp_list.field_0x18,800,(value_type *)auStack_78,(allocator_type *)auStack_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_78);
  start.g_cost_ = -NAN;
  start.f_cost_ = 2.12199579096527e-314;
  auStack_78 = (undefined1  [8])0x100000001;
  start.x_ = 0;
  start.y_ = -1;
  __l._M_len = 8;
  __l._M_array = (iterator)auStack_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &parentDir.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,
             (allocator_type *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  start.g_cost_ = -NAN;
  start.f_cost_ = -NAN;
  auStack_78 = (undefined1  [8])0x100000000;
  start.x_ = 1;
  start.y_ = 1;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)auStack_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_00,(allocator_type *)auStack_58);
  nodes::nodes((nodes *)auStack_78,this->x_start_,this->y_start_,0.0,0.0);
  start.g_cost_ = nodes::compute_f((nodes *)auStack_78,this->x_goal_,this->y_goal_);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::push
            ((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
              *)auStack_c8,(value_type *)auStack_78);
  (((pointer)((long)local_168 + (long)(int)auStack_78._0_4_ * 0x18))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(int)auStack_78._4_4_] = (int)start.g_cost_;
  bVar4 = false;
  do {
    if (auStack_c8 ==
        (undefined1  [8])
        open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.
        super__Vector_impl_data._M_start) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Path not found.");
      std::endl<char,std::char_traits<char>>(poVar6);
      auStack_58._0_4_ = -1;
      auStack_58._4_4_ = -1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 __return_storage_ptr__,(pair<int,_int> *)auStack_58);
      bVar4 = true;
      break;
    }
    current.g_cost_ = *(double *)((long)auStack_c8 + 0x10);
    auStack_58 = *(undefined1 (*) [8])auStack_c8;
    current._0_8_ = *(double *)((long)auStack_c8 + 8);
    std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
    pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> *)
        auStack_c8);
    (((pointer)((long)local_168 + (long)(int)auStack_58._0_4_ * 0x18))->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [(int)auStack_58._4_4_] = 0;
    *(undefined4 *)
     (*(long *)(CONCAT44(open.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         open.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) +
               (long)(int)auStack_58._0_4_ * 0x18) + (long)(int)auStack_58._4_4_ * 4) = 1;
    if ((auStack_58._0_4_ == this->x_goal_) &&
       (iVar7 = auStack_58._0_4_, iVar10 = auStack_58._4_4_, auStack_58._4_4_ == this->y_goal_)) {
      for (; (iVar7 != this->x_start_ || (iVar10 != this->y_start_));
          iVar10 = iVar10 + moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage[lVar11]) {
        lVar11 = (long)*(int *)(*(long *)(CONCAT44(temp_list._28_4_,temp_list._24_4_) +
                                         (long)iVar7 * 0x18) + (long)iVar10 * 4);
        open_list._28_4_ = iVar10;
        open_list._24_4_ = iVar7;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,(pair<int,_int> *)&open_list.field_0x18);
        iVar7 = iVar7 + *(int *)(CONCAT44(parentDir.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                          parentDir.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)
                                + lVar11 * 4);
      }
      bVar3 = false;
      bVar4 = true;
    }
    else {
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
        x = *(int *)(CONCAT44(parentDir.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              parentDir.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + lVar11 * 4
                    ) + auStack_58._0_4_;
        if (x < 800) {
          y = moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[lVar11] + auStack_58._4_4_;
          if (y < 800) {
            uVar5 = (ulong)x;
            lVar9 = uVar5 * 0x18;
            uVar8 = (ulong)y;
            if ((*(int *)(*(long *)&(map->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + uVar8 * 4) != 0) &&
               (*(int *)(*(long *)(CONCAT44(open.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                            ,open.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _0_4_) + lVar9) + uVar8 * 4) != 1)) {
              nodes::nodes((nodes *)&open_list.field_0x18,x,y,(double)current._0_8_,current.g_cost_)
              ;
              k = (uint)lVar11;
              nodes::compute_g((nodes *)&open_list.field_0x18,k);
              dVar2 = nodes::compute_f((nodes *)&open_list.field_0x18,this->x_goal_,this->y_goal_);
              piVar1 = (((pointer)((long)local_168 + uVar5 * 0x18))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if (piVar1[uVar8] == 0) {
                piVar1[uVar8] = (int)dVar2;
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_c8,(value_type *)&open_list.field_0x18);
                *(uint *)(*(long *)(CONCAT44(temp_list._28_4_,temp_list._24_4_) + lVar9) + uVar8 * 4
                         ) = k ^ 4;
              }
              else if (dVar2 < (double)piVar1[uVar8]) {
                piVar1[uVar8] = (int)dVar2;
                *(uint *)(*(long *)(CONCAT44(temp_list._28_4_,temp_list._24_4_) + lVar9) + uVar8 * 4
                         ) = k ^ 4;
                while ((*(int *)auStack_c8 != x || (*(int *)((long)auStack_c8 + 4) != y))) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)&visited.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (value_type *)auStack_c8);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)auStack_c8);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                       *)auStack_c8);
                while ((pointer)visited.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                       temp_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.
                       super__Vector_impl_data._M_start) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)auStack_c8,
                         (value_type *)
                         visited.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)&visited.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_c8,(value_type *)&open_list.field_0x18);
              }
              nodes::~nodes((nodes *)&open_list.field_0x18);
            }
          }
        }
      }
      bVar3 = true;
    }
    nodes::~nodes((nodes *)auStack_58);
  } while (bVar3);
  nodes::~nodes((nodes *)auStack_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &parentDir.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&temp_list.field_0x18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&open.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_168);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)
             &visited.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)auStack_c8);
  if (!bVar4) {
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, int>> astar::astar_path(
                                std::vector<std::vector<int>> map) {
    int neighbours = 8;  // max no of possible neighbors for any node

    std::vector<std::pair<int, int>> path;
    // Create a priority list of open nodes
    std::priority_queue<nodes, std::vector<nodes>,
                        std::greater<nodes>> open_list;
    // Create a priority list to store temporary nodes
    std::priority_queue<nodes, std::vector<nodes>,
                          std::greater<nodes>> temp_list;
    // Create 2D vectors to store open and visited nodes.
    std::vector<std::vector<int> > open(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > visited(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > parentDir(800, std::vector<int>(800, 0));

    // 8 possible moves in x and y direction
    std::vector<int> moveX { 1, 1, 0, -1, -1, -1, 0, 1 };
    std::vector<int> moveY { 0, 1, 1, 1, 0, -1, -1, -1 };

    nodes start(x_start_, y_start_, 0, 0);
    start.f_cost_ = start.compute_f(x_goal_, y_goal_);
    open_list.push(start);
    open[start.x_][start.y_] = start.f_cost_;

    /**This loop takes the first entry of the open list as the current node
     * since it has the lowest total cost function.*/

    while (!open_list.empty()) {
      nodes current = open_list.top();
      open_list.pop();
      open[current.x_][current.y_] = 0;
      visited[current.x_][current.y_] = 1;

      /** Trace the path and store it of the goal is found.*/

      if (current.x_ == x_goal_ && current.y_ == y_goal_) {
        int p = current.x_, q = current.y_;
        while (!(p == x_start_ && q == y_start_)) {
          int j = parentDir[p][q];
          path.push_back(std::make_pair(p, q));
          p += moveX[j];
          q += moveY[j];
        }
        return path;
      }

      /** Expand all the nodes for current node, calculate their 
       * costs and store them in their variables.*/
      int dir = 0;
      while (dir < 8) {
          int dx = current.x_ + moveX[dir], dy = current.y_ + moveY[dir];
          /** For all the nodes lying outside the map, blocked
           * or is in the visisted list then simply ignor them.*/
        if (!(dx < 0 || dx > 799 || dy < 0 || dy > 799 ||
              map[dx][dy] == 0 || visited[dx][dy] == 1)) {
            nodes child(dx, dy, current.g_cost_, current.f_cost_);
            child.g_cost_ = child.compute_g(dir);
            child.f_cost_ = child.compute_f(x_goal_, y_goal_);
            /* For new nodes, calculate their costs and store them.*/
          if (open[dx][dy] == 0) {
              open[dx][dy] = child.f_cost_;
              open_list.push(child);
              parentDir[dx][dy] = (dir + neighbours / 2) % neighbours;
            /* If the node exists in open list but has more
            * promising total cost then it is replaced by
            * the previous node and it's parent direction is updated.*/
            } else if (open[dx][dy] > child.f_cost_) {
              open[dx][dy] = child.f_cost_;
              parentDir[dx][dy] = (dir + 8 / 2) % 8;
            while (!(open_list.top().x_ == dx && open_list.top().y_ == dy)) {
              temp_list.push(open_list.top());
              open_list.pop();
            }
            open_list.pop();
            while (!temp_list.empty()) {
              open_list.push(temp_list.top());
              temp_list.pop();
            }
            open_list.push(child);
          }
        }
        ++dir;
      }
    }
    std::cout << "Path not found."
              << std::endl;
    path.push_back(std::make_pair(-1, -1));
    return path;
}